

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cpp
# Opt level: O1

void __thiscall
pstore::exchange::export_ns::emit_database(export_ns *this,database *db,ostream *os,bool comments)

{
  value_type vVar1;
  index_pointer node;
  undefined4 uVar2;
  pointer ptVar3;
  hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *phVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  ostream_base *poVar8;
  ulong uVar9;
  typed_address<pstore::trailer> tVar10;
  undefined7 in_register_00000009;
  size_t sVar11;
  diff_out<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_exchange_export_cpp:56:29)>
  __n;
  pointer __n_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  undefined8 extraout_RDX;
  pointer __buf_06;
  pointer ptVar12;
  void *extraout_RDX_00;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *__buf_11;
  void *extraout_RDX_08;
  void *extraout_RDX_09;
  void *__buf_12;
  void *__buf_13;
  void *__buf_14;
  void *__buf_15;
  void *__buf_16;
  void *__buf_17;
  void *__buf_18;
  void *extraout_RDX_10;
  void *extraout_RDX_11;
  void *pvVar13;
  void *__buf_19;
  void *__buf_20;
  int iVar14;
  pointer ptVar15;
  undefined1 uVar16;
  bool bVar17;
  generation_iterator __first;
  generation_iterator __last;
  bool first;
  indent object_indent;
  indent ind;
  indent object_indent_1;
  vector<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
  f;
  shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  debug_line_headers;
  shared_ptr<const_pstore::trailer> footer;
  string_mapping string_table;
  string_mapping path_table;
  undefined1 local_16d [9];
  indent local_164;
  indent local_160;
  indent local_15c;
  string local_158;
  uint local_138;
  indent local_134;
  string local_130;
  hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  **local_110;
  export_ns *local_108;
  uint local_100;
  int local_fc;
  vector<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
  local_f8;
  ulong local_e0;
  database *local_d8;
  hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  pointer local_c0;
  pointer local_b8;
  undefined1 local_b0 [72];
  _Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  sVar11 = CONCAT71(in_register_00000009,comments);
  local_138 = (uint)os;
  string_mapping::string_mapping<(pstore::trailer::indices)3>
            ((string_mapping *)(local_b0 + 0x10),this);
  string_mapping::string_mapping<(pstore::trailer::indices)4>((string_mapping *)&local_68,this);
  local_164.distance_ = 1;
  ostream_base::write((ostream_base *)db,0x1249b8,__buf,sVar11);
  poVar8 = operator<<((ostream_base *)db,&local_164);
  poVar8 = (ostream_base *)ostream_base::write(poVar8,0x1249bb,__buf_00,sVar11);
  ostream_base::write(poVar8,10,__buf_01,sVar11);
  poVar8 = operator<<((ostream_base *)db,&local_164);
  poVar8 = (ostream_base *)ostream_base::write(poVar8,0x1249c8,__buf_02,sVar11);
  local_158._M_dataplus._M_p = *(pointer *)(*(long *)(this + 0x48) + 0x10);
  local_158._M_string_length = *(undefined8 *)(*(long *)(this + 0x48) + 0x18);
  uuid::str_abi_cxx11_(&local_130,(uuid *)&local_158);
  poVar8 = (ostream_base *)ostream_base::write(poVar8,(int)&local_130,__buf_03,sVar11);
  ostream_base::write(poVar8,0x1249cf,__buf_04,sVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,(ulong)(local_130.field_2._M_allocated_capacity + 1))
    ;
  }
  poVar8 = operator<<((ostream_base *)db,&local_164);
  ostream_base::write(poVar8,0x1249d3,__buf_05,sVar11);
  uVar6 = database::get_current_revision((database *)this);
  local_f8.
  super__Vector_base<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
  ::reserve(&local_f8,(ulong)(uVar6 + 1));
  local_130._M_dataplus._M_p = (pointer)this;
  __first = generation_container::begin((generation_container *)&local_130);
  __last = generation_container::end((generation_container *)&local_130);
  std::__copy_move<false,false,std::input_iterator_tag>::
  __copy_m<pstore::generation_iterator,std::back_insert_iterator<std::vector<pstore::typed_address<pstore::trailer>,std::allocator<pstore::typed_address<pstore::trailer>>>>>
            (__first,__last,&local_f8);
  ptVar3 = local_f8.
           super__Vector_base<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ptVar15 = local_f8.
            super__Vector_base<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = (long)local_f8.
                super__Vector_base<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_f8.
                super__Vector_base<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  if (uVar9 != uVar6 + 1) {
    assert_failed("footers.size () == num_transactions",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/export.cpp"
                  ,0x25);
  }
  __buf_06 = (pointer)CONCAT71((int7)((ulong)extraout_RDX >> 8),
                               local_f8.
                               super__Vector_base<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
                               ._M_impl.super__Vector_impl_data._M_start !=
                               local_f8.
                               super__Vector_base<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
  __n_00 = local_f8.
           super__Vector_base<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
  if (local_f8.
      super__Vector_base<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
      ._M_impl.super__Vector_impl_data._M_start < __n_00 &&
      local_f8.
      super__Vector_base<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_f8.
      super__Vector_base<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ptVar12 = local_f8.
              super__Vector_base<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1;
    do {
      vVar1 = ptVar12[-1].a_.a_;
      ptVar12[-1].a_.a_ = (__n_00->a_).a_;
      (__n_00->a_).a_ = vVar1;
      __n_00 = __n_00 + -1;
      __buf_06 = ptVar12 + 1;
      bVar17 = ptVar12 < __n_00;
      ptVar12 = __buf_06;
    } while (bVar17);
  }
  if ((long)uVar9 < 1) {
    assert_failed("std::distance (std::begin (f), std::end (f)) >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/export.cpp"
                  ,0x67);
  }
  local_e0 = (ulong)local_164.distance_;
  local_134.distance_ = 0;
  ostream_base::write((ostream_base *)db,0x124dde,__buf_06,(size_t)__n_00);
  ptVar15 = ptVar15 + 1;
  pvVar13 = extraout_RDX_00;
  if (ptVar15 == ptVar3) {
    iVar14 = 0x12411a;
  }
  else {
    local_100 = (int)local_e0 + 1;
    iVar14 = 0x12411a;
    local_16d._5_4_ = local_138 & 0xff;
    local_c0 = ptVar3;
    local_d8 = db;
    do {
      poVar8 = (ostream_base *)ostream_base::write((ostream_base *)db,iVar14,pvVar13,(size_t)__n_00)
      ;
      ostream_base::write(poVar8,10,__buf_07,(size_t)__n_00);
      local_160.distance_ = local_100;
      sVar11 = 1;
      database::getro<pstore::trailer,void>
                ((database *)local_b0,(typed_address<pstore::trailer>)this,(ptVar15->a_).a_);
      uVar6 = *(uint *)(local_b0._0_8_ + 8);
      database::sync((database *)this);
      poVar8 = operator<<((ostream_base *)db,&local_160);
      ostream_base::write(poVar8,0x1249b8,__buf_08,sVar11);
      local_16d._1_4_ = local_160.distance_ + 1;
      if ((char)local_138 != '\0') {
        poVar8 = operator<<((ostream_base *)db,(indent *)(local_16d + 1));
        poVar8 = (ostream_base *)ostream_base::write(poVar8,0x124de0,__buf_09,sVar11);
        poVar8 = ostream_base::write<unsigned_int,void>(poVar8,uVar6);
        ostream_base::write(poVar8,10,__buf_10,sVar11);
      }
      uVar2 = local_16d._1_4_;
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      local_158._M_string_length = 5;
      local_158.field_2._M_allocated_capacity._0_6_ = 0x73656d616e;
      anon_unknown.dwarf_6760e::prefix(&local_130,false,(indent)local_16d._1_4_,&local_158);
      local_b8 = ptVar15;
      bVar17 = emit_strings<(pstore::trailer::indices)3>
                         ((ostream_base *)db,(indent)uVar2,(database *)this,uVar6,&local_130,
                          (string_mapping *)(local_b0 + 0x10),SUB41(local_16d._5_4_,0));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,
                        (ulong)(local_130.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      uVar2 = local_16d._1_4_;
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      local_158._M_string_length = 5;
      local_158.field_2._M_allocated_capacity._0_6_ = 0x7368746170;
      anon_unknown.dwarf_6760e::prefix(&local_130,bVar17,(indent)local_16d._1_4_,&local_158);
      __n.fn_ = (anon_class_48_6_94d7406f *)(ulong)uVar6;
      bVar5 = emit_strings<(pstore::trailer::indices)4>
                        ((ostream_base *)local_d8,(indent)uVar2,(database *)this,uVar6,&local_130,
                         (string_mapping *)&local_68,SUB41(local_16d._5_4_,0));
      pvVar13 = extraout_RDX_01;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,
                        (ulong)(local_130.field_2._M_allocated_capacity + 1));
        pvVar13 = extraout_RDX_02;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        pvVar13 = extraout_RDX_03;
      }
      ptVar15 = local_b8;
      db = local_d8;
      if (bVar17 || bVar5) {
        ostream_base::write((ostream_base *)local_d8,0x1249d0,pvVar13,(size_t)__n.fn_);
      }
      local_15c.distance_ = local_16d._1_4_;
      index::
      get_index<(pstore::trailer::indices)1,pstore::database_const,pstore::index::hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>const>
                ((index *)&local_d0,(database *)this,true);
      bVar17 = index::
               hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
               ::empty(local_d0);
      phVar4 = local_d0;
      if (bVar17) {
        pvVar13 = extraout_RDX_04;
        uVar16 = '\0';
      }
      else {
        if (uVar6 == 0) {
          assert_failed("generation > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/export.cpp"
                        ,0x35);
        }
        local_16d[0] = '\x01';
        local_fc = local_15c.distance_ + 1;
        local_130._M_dataplus._M_p = local_16d;
        local_130._M_string_length = (size_type)db;
        local_130.field_2._M_allocated_capacity = (size_type)&local_15c;
        local_130.field_2._8_8_ = &local_fc;
        local_110 = &local_d0;
        local_108 = this;
        uVar7 = database::get_current_revision((database *)this);
        pvVar13 = extraout_RDX_05;
        if (uVar6 - 1 <= uVar7) {
          tVar10 = database::older_revision_footer_pos((database *)this,uVar6 - 1);
          local_158.field_2._M_allocated_capacity = (long)tVar10.a_.a_ + 0x70;
          local_158._M_string_length = (size_type)phVar4;
          node = phVar4->root_;
          pvVar13 = extraout_RDX_06;
          local_158._M_dataplus._M_p = (pointer)this;
          if (node.internal_ != (internal_node *)0x0) {
            __n.fn_ = (anon_class_48_6_94d7406f *)&local_130;
            diff_details::
            traverser<pstore::index::hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
            ::
            visit_node<pstore::exchange::export_ns::diff_out<(anonymous_namespace)::emit_debug_line_headers(pstore::exchange::export_ns::ostream&,pstore::exchange::export_ns::indent,pstore::database_const&,unsigned_int)::__0>>
                      ((traverser<pstore::index::hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
                        *)&local_158,node,0,(anon_class_48_6_94d7406f *)&local_130);
            pvVar13 = extraout_RDX_07;
          }
        }
        uVar16 = local_16d[0];
        if (local_16d[0] == '\0') {
          poVar8 = (ostream_base *)
                   ostream_base::write((ostream_base *)db,10,pvVar13,(size_t)__n.fn_);
          poVar8 = operator<<(poVar8,&local_15c);
          ostream_base::write(poVar8,0x124e0b,__buf_11,(size_t)__n.fn_);
          pvVar13 = extraout_RDX_08;
          uVar16 = local_16d[0];
        }
      }
      if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
        pvVar13 = extraout_RDX_09;
      }
      if (uVar16 != '\0') {
        ostream_base::write((ostream_base *)db,0x1249d0,pvVar13,(size_t)__n.fn_);
      }
      poVar8 = operator<<((ostream_base *)db,(indent *)(local_16d + 1));
      ostream_base::write(poVar8,0x124dfd,__buf_12,(size_t)__n.fn_);
      sVar11 = (size_t)uVar6;
      emit_fragments((ostream *)db,(indent)(local_16d._1_4_ + 1),(database *)this,uVar6,
                     (string_mapping *)(local_b0 + 0x10),SUB41(local_16d._5_4_,0));
      poVar8 = (ostream_base *)ostream_base::write((ostream_base *)db,10,__buf_13,sVar11);
      poVar8 = operator<<(poVar8,(indent *)(local_16d + 1));
      ostream_base::write(poVar8,0x124e0b,__buf_14,sVar11);
      poVar8 = operator<<((ostream_base *)db,(indent *)(local_16d + 1));
      ostream_base::write(poVar8,0x124e0f,__buf_15,sVar11);
      __n_00 = (pointer)(ulong)uVar6;
      emit_compilation_index
                ((ostream_base *)db,(indent)(local_16d._1_4_ + 1),(database *)this,uVar6,
                 (string_mapping *)(local_b0 + 0x10),SUB41(local_16d._5_4_,0));
      poVar8 = (ostream_base *)ostream_base::write((ostream_base *)db,10,__buf_16,(size_t)__n_00);
      poVar8 = operator<<(poVar8,(indent *)(local_16d + 1));
      ostream_base::write(poVar8,0x124a73,__buf_17,(size_t)__n_00);
      poVar8 = operator<<((ostream_base *)db,&local_160);
      ostream_base::write(poVar8,0x7d,__buf_18,(size_t)__n_00);
      pvVar13 = extraout_RDX_10;
      if ((array<pstore::sat_entry,_65536UL> *)local_b0._8_8_ !=
          (array<pstore::sat_entry,_65536UL> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
        pvVar13 = extraout_RDX_11;
      }
      local_134.distance_ = (uint)local_e0;
      ptVar15 = ptVar15 + 1;
      iVar14 = 0x1249c6;
    } while (ptVar15 != local_c0);
    iVar14 = 0x124119;
  }
  poVar8 = (ostream_base *)ostream_base::write((ostream_base *)db,iVar14,pvVar13,(size_t)__n_00);
  poVar8 = operator<<(poVar8,&local_134);
  ostream_base::write(poVar8,0x124caf,__buf_19,(size_t)__n_00);
  ostream_base::write((ostream_base *)db,0x124a72,__buf_20,(size_t)__n_00);
  if (local_f8.
      super__Vector_base<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.
                    super__Vector_base<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.
                          super__Vector_base<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.
                          super__Vector_base<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  std::
  _Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_b0 + 0x10));
  return;
}

Assistant:

void emit_database (database & db, ostream & os, bool const comments) {
                string_mapping string_table{db, name_index_tag ()};
                string_mapping path_table{db, path_index_tag ()};

                auto const ind = indent{}.next ();
                os << "{\n";
                os << ind << R"("version":1,)" << '\n';
                os << ind << R"("id":")" << db.get_header ().id ().str () << "\",\n";
                os << ind << R"("transactions":)";

                auto const f = footers (db);
                PSTORE_ASSERT (std::distance (std::begin (f), std::end (f)) >= 1);
                emit_array (
                    os, ind, std::next (std::begin (f)), std::end (f),
                    [&] (ostream & os1, indent const ind1,
                         pstore::typed_address<pstore::trailer> const footer_pos) {
                        auto const footer = db.getro (footer_pos);
                        unsigned const generation = footer->a.generation;
                        db.sync (generation);
                        os1 << ind1 << "{\n";
                        auto const object_indent = ind1.next ();
                        if (comments) {
                            os1 << object_indent << "// transaction #" << generation << '\n';
                        }
                        bool const names_emitted = emit_strings<trailer::indices::name> (
                            os1, object_indent, db, generation,
                            prefix (false, object_indent, "names"), &string_table, comments);
                        bool const paths_emitted = emit_strings<trailer::indices::path> (
                            os1, object_indent, db, generation,
                            prefix (names_emitted, object_indent, "paths"), &path_table, comments);
                        if (paths_emitted || names_emitted) {
                            os1 << ",\n";
                        }
                        if (emit_debug_line_headers (os1, object_indent, db, generation)) {
                            os1 << ",\n";
                        }
                        os1 << object_indent << R"("fragments":{)";
                        emit_fragments (os1, object_indent.next (), db, generation, string_table,
                                        comments);
                        os1 << '\n' << object_indent << "},\n";
                        os1 << object_indent << R"("compilations":{)";
                        emit_compilation_index (os1, object_indent.next (), db, generation,
                                                string_table, comments);
                        os1 << '\n' << object_indent << "}\n";
                        os1 << ind1 << '}';
                    });
                os << "\n}\n";
            }